

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SysAllocService.cpp
# Opt level: O0

void anon_unknown.dwarf_47f904::sysalloc_initialize(Caliper *c,Channel *chn)

{
  Events *pEVar1;
  ostream *poVar2;
  socklen_t in_ECX;
  sockaddr *__addr;
  sockaddr *__addr_00;
  string local_2a0;
  Log local_280;
  anon_class_1_0_00000001 local_71;
  function<void_(cali::Caliper_*,_cali::Channel_*)> local_70;
  anon_class_1_0_00000001 local_39;
  function<void_(cali::Caliper_*,_cali::Channel_*)> local_38;
  Channel *local_18;
  Channel *chn_local;
  Caliper *c_local;
  
  local_18 = chn;
  chn_local = (Channel *)c;
  pEVar1 = cali::Channel::events(chn);
  std::function<void(cali::Caliper*,cali::Channel*)>::
  function<(anonymous_namespace)::sysalloc_initialize(cali::Caliper*,cali::Channel*)::__0,void>
            ((function<void(cali::Caliper*,cali::Channel*)> *)&local_38,&local_39);
  cali::util::callback<void_(cali::Caliper_*,_cali::Channel_*)>::connect
            (&pEVar1->post_init_evt,(int)&local_38,__addr,in_ECX);
  std::function<void_(cali::Caliper_*,_cali::Channel_*)>::~function(&local_38);
  pEVar1 = cali::Channel::events(local_18);
  std::function<void(cali::Caliper*,cali::Channel*)>::
  function<(anonymous_namespace)::sysalloc_initialize(cali::Caliper*,cali::Channel*)::__1,void>
            ((function<void(cali::Caliper*,cali::Channel*)> *)&local_70,&local_71);
  cali::util::callback<void_(cali::Caliper_*,_cali::Channel_*)>::connect
            (&pEVar1->pre_finish_evt,(int)&local_70,__addr_00,in_ECX);
  std::function<void_(cali::Caliper_*,_cali::Channel_*)>::~function(&local_70);
  cali::Log::Log(&local_280,1);
  poVar2 = cali::Log::stream(&local_280);
  cali::Channel::name_abi_cxx11_(&local_2a0,local_18);
  poVar2 = std::operator<<(poVar2,(string *)&local_2a0);
  poVar2 = std::operator<<(poVar2,": Registered sysalloc service");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_2a0);
  cali::Log::~Log(&local_280);
  return;
}

Assistant:

void sysalloc_initialize(Caliper* c, Channel* chn)
{
    chn->events().post_init_evt.connect([](Caliper* c, Channel* chn) {
        if (!bindings_are_active)
            init_alloc_hooks();

        ChannelList::add(&sysalloc_channels, *chn);
    });

    chn->events().pre_finish_evt.connect([](Caliper* c, Channel* chn) {
        Log(2).stream() << chn->name() << ": Removing sysalloc hooks" << std::endl;
        ChannelList::remove(&sysalloc_channels, *chn);
    });

    Log(1).stream() << chn->name() << ": Registered sysalloc service" << std::endl;
}